

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void statement(LexState *ls)

{
  l_uint32 *plVar1;
  char cVar2;
  Instruction *pIVar3;
  Dyndata *pDVar4;
  FuncState *pFVar5;
  byte bVar6;
  lu_byte lVar7;
  int iVar8;
  expkind list;
  int iVar9;
  int iVar10;
  int iVar11;
  uint first;
  uint uVar12;
  BlockCnt *pBVar13;
  TString *pTVar14;
  long lVar15;
  TString *pTVar16;
  ulong extraout_RAX;
  ulong uVar17;
  ulong uVar18;
  Labeldesc *pLVar19;
  long lVar20;
  char *pcVar21;
  FuncState *pFVar22;
  char **__s1;
  Vardesc *pVVar23;
  FuncState *fs;
  bool bVar24;
  BlockCnt bl1;
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  FuncState *local_58;
  uint local_4c;
  undefined1 local_48 [16];
  byte local_38;
  undefined2 local_37;
  lu_byte local_35;
  
  iVar10 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar8 = (ls->t).token;
  switch(iVar8) {
  case 0x101:
    pBVar13 = (BlockCnt *)&ls->fs->bl;
    do {
      pBVar13 = pBVar13->previous;
      if (pBVar13 == (BlockCnt *)0x0) goto LAB_0011490e;
    } while (pBVar13->isloop == '\0');
    pBVar13->isloop = '\x02';
    luaX_next(ls);
    pTVar14 = luaS_newlstr(ls->L,"break",5);
    goto LAB_00113fde;
  case 0x102:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar10);
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10b:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x112:
  case 0x113:
  case 0x114:
    goto switchD_00113d78_caseD_103;
  case 0x107:
    pFVar22 = ls->fs;
    local_38 = pFVar22->nactvar;
    pDVar4 = pFVar22->ls->dyd;
    local_48._8_4_ = (pDVar4->label).n;
    local_48._12_4_ = (pDVar4->gt).n;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\x01';
    local_48._0_8_ = pFVar22->bl;
    if ((BlockCnt *)local_48._0_8_ == (BlockCnt *)0x0) {
      local_35 = false;
    }
    else {
      local_35 = ((BlockCnt *)local_48._0_8_)->insidetbc != '\0';
    }
    pFVar22->bl = (BlockCnt *)local_48;
    luaX_next(ls);
    pTVar14 = str_checkname(ls);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x2c) || (iVar8 == 0x10b)) {
      pFVar5 = ls->fs;
      local_4c = (uint)pFVar5->freereg;
      local_58 = pFVar22;
      pTVar16 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar16,'\0');
      pTVar16 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar16,'\0');
      pTVar16 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar16,'\0');
      iVar8 = 1;
      new_localvarkind(ls,pTVar14,'\x01');
      if ((ls->t).token == 0x2c) {
        iVar8 = 1;
        do {
          luaX_next(ls);
          pTVar14 = str_checkname(ls);
          new_localvarkind(ls,pTVar14,'\0');
          iVar8 = iVar8 + 1;
        } while ((ls->t).token == 0x2c);
      }
      checknext(ls,0x10b);
      iVar9 = ls->linenumber;
      iVar11 = explist(ls,(expdesc *)local_78);
      adjust_assign(ls,4,iVar11,(expdesc *)local_78);
      adjustlocalvars(ls,3);
      pBVar13 = pFVar5->bl;
      pBVar13->upval = '\x01';
      pBVar13->insidetbc = '\x01';
      pFVar5->needclose = '\x01';
      luaK_checkstack(pFVar5,2);
      forbody(ls,local_4c,iVar9,iVar8,1);
      pFVar22 = local_58;
    }
    else {
      if (iVar8 != 0x3d) {
        pcVar21 = "\'=\' or \'in\' expected";
        goto LAB_00114915;
      }
      pFVar5 = ls->fs;
      local_58 = (FuncState *)CONCAT44(local_58._4_4_,(uint)pFVar5->freereg);
      pTVar16 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar16,'\0');
      pTVar16 = luaX_newstring(ls,"(for state)",0xb);
      new_localvarkind(ls,pTVar16,'\0');
      new_localvarkind(ls,pTVar14,'\x01');
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        luaK_int(pFVar5,(uint)pFVar5->freereg,1);
        luaK_reserveregs(pFVar5,1);
      }
      adjustlocalvars(ls,2);
      forbody(ls,(int)local_58,iVar10,1,0);
    }
    check_match(ls,0x105,0x107,iVar10);
    goto LAB_0011488e;
  case 0x108:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar8 = (ls->t).token, iVar8 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar8 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)local_48,(uint)(iVar8 == 0x3a),iVar10);
    check_readonly(ls,(expdesc *)local_78);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)local_48);
    luaK_fixline(ls->fs,iVar10);
    break;
  case 0x109:
    luaX_next(ls);
    pTVar14 = str_checkname(ls);
LAB_00113fde:
    newgotoentry(ls,pTVar14,iVar10);
    break;
  case 0x10a:
    pFVar22 = ls->fs;
    local_78._0_4_ = 0xffffffff;
    do {
      test_then_block(ls,(int *)local_78);
      iVar8 = (ls->t).token;
    } while (iVar8 == 0x104);
    if (iVar8 == 0x103) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x105,0x10a,iVar10);
    list = local_78._0_4_;
    goto LAB_001146e9;
  case 0x10c:
    luaX_next(ls);
    if ((ls->t).token == 0x108) {
      luaX_next(ls);
      pFVar22 = ls->fs;
      bVar6 = pFVar22->nactvar;
      pTVar14 = str_checkname(ls);
      new_localvarkind(ls,pTVar14,'\0');
      adjustlocalvars(ls,1);
      body(ls,(expdesc *)local_78,0,ls->linenumber);
      pFVar22->f->locvars
      [*(short *)((long)(pFVar22->ls->dyd->actvar).arr +
                 ((long)pFVar22->firstlocal + (ulong)bVar6) * 0x18 + 0xc)].startpc = pFVar22->pc;
    }
    else {
      pFVar22 = ls->fs;
      iVar8 = -1;
      iVar10 = 0;
      while( true ) {
        pTVar14 = str_checkname(ls);
        bVar24 = false;
        lVar7 = '\0';
        if ((ls->t).token == 0x3c) {
          luaX_next(ls);
          pTVar16 = str_checkname(ls);
          __s1 = &pTVar16->contents;
          if (pTVar16->shrlen < '\0') {
            __s1 = (char **)*__s1;
          }
          checknext(ls,0x3e);
          iVar9 = strcmp((char *)__s1,"const");
          if (iVar9 == 0) {
            lVar7 = '\x01';
            bVar24 = false;
          }
          else {
            iVar9 = strcmp((char *)__s1,"close");
            if (iVar9 != 0) {
              pcVar21 = luaO_pushfstring(ls->L,"unknown attribute \'%s\'",__s1);
              luaK_semerror(ls,pcVar21);
            }
            lVar7 = '\x02';
            bVar24 = true;
          }
        }
        iVar9 = new_localvarkind(ls,pTVar14,lVar7);
        if (bVar24) {
          if (iVar8 != -1) {
            luaK_semerror(ls,"multiple to-be-closed variables in local list");
          }
          iVar8 = (uint)pFVar22->nactvar + iVar10;
        }
        if ((ls->t).token != 0x2c) break;
        luaX_next(ls);
        iVar10 = iVar10 + 1;
      }
      if ((ls->t).token == 0x3d) {
        luaX_next(ls);
        iVar11 = explist(ls,(expdesc *)local_78);
      }
      else {
        local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
        iVar11 = 0;
      }
      if (((iVar11 + -1 == iVar10) &&
          (pVVar23 = (pFVar22->ls->dyd->actvar).arr + (long)iVar9 + (long)pFVar22->firstlocal,
          (pVVar23->vd).kind == '\x01')) &&
         (iVar9 = luaK_exp2const(pFVar22,(expdesc *)local_78,&pVVar23->k), iVar9 != 0)) {
        (pVVar23->vd).kind = '\x03';
        adjustlocalvars(ls,iVar10);
        pFVar22->nactvar = pFVar22->nactvar + '\x01';
      }
      else {
        adjust_assign(ls,iVar10 + 1,iVar11,(expdesc *)local_78);
        adjustlocalvars(ls,iVar10 + 1);
      }
      if (iVar8 != -1) {
        pBVar13 = pFVar22->bl;
        pBVar13->upval = '\x01';
        pBVar13->insidetbc = '\x01';
        pFVar22->needclose = '\x01';
        uVar12 = iVar8 - 1;
        lVar15 = (long)(int)uVar12;
        do {
          if (iVar8 < 1) {
            bVar6 = 0;
            break;
          }
          pVVar23 = (pFVar22->ls->dyd->actvar).arr;
          lVar20 = pFVar22->firstlocal + lVar15;
          cVar2 = *(char *)((long)pVVar23 + lVar20 * 0x18 + 9);
          if (cVar2 != '\x03') {
            uVar12 = (uint)(byte)((&pVVar23->vd)[lVar20].ridx + 1);
          }
          bVar6 = (byte)uVar12;
          lVar15 = lVar15 + -1;
          iVar8 = iVar8 + -1;
        } while (cVar2 == '\x03');
        luaK_codeABCk(pFVar22,OP_TBC,(uint)bVar6,0,0,0);
      }
    }
    break;
  case 0x110:
    pFVar22 = ls->fs;
    iVar8 = luaK_getlabel(pFVar22);
    local_38 = pFVar22->nactvar;
    pDVar4 = pFVar22->ls->dyd;
    local_70._0_4_ = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70[9] = 0;
    local_70[8] = local_38;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar22->bl;
    if (local_78 == (undefined1  [8])0x0) {
      local_35 = false;
    }
    else {
      local_35 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = local_35;
    pFVar22->bl = (BlockCnt *)local_78;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\0';
    pFVar22->bl = (BlockCnt *)local_48;
    local_48._0_8_ = (BlockCnt *)local_78;
    local_48._8_4_ = local_70._0_4_;
    local_48._12_4_ = local_70._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x114,0x110,iVar10);
    iVar10 = cond(ls);
    leaveblock(pFVar22);
    if ((lu_byte)local_37 != '\0') {
      iVar9 = luaK_jump(pFVar22);
      luaK_patchtohere(pFVar22,iVar10);
      uVar18 = (ulong)local_38;
      uVar17 = extraout_RAX;
      do {
        if ((int)uVar18 < 1) {
          bVar6 = 0;
          break;
        }
        pVVar23 = (pFVar22->ls->dyd->actvar).arr;
        lVar15 = (long)pFVar22->firstlocal + uVar18;
        cVar2 = *(char *)((long)pVVar23 + lVar15 * 0x18 + -0xf);
        if (cVar2 != '\x03') {
          uVar17 = (ulong)(byte)(*(char *)((long)pVVar23 + lVar15 * 0x18 + -0xe) + 1);
        }
        bVar6 = (byte)uVar17;
        uVar18 = uVar18 - 1;
      } while (cVar2 == '\x03');
      luaK_codeABCk(pFVar22,OP_CLOSE,(uint)bVar6,0,0,0);
      iVar10 = luaK_jump(pFVar22);
      luaK_patchtohere(pFVar22,iVar9);
    }
    luaK_patchlist(pFVar22,iVar10,iVar8);
LAB_0011488e:
    leaveblock(pFVar22);
    break;
  case 0x111:
    luaX_next(ls);
    pFVar22 = ls->fs;
    bVar6 = luaY_nvarstack(pFVar22);
    iVar10 = (ls->t).token;
    uVar12 = iVar10 - 0x103;
    first = (uint)bVar6;
    iVar8 = 0;
    if ((iVar10 != 0x3b) &&
       (iVar8 = 0, (uVar12 < 0x1e & (byte)(0x20020007 >> ((byte)uVar12 & 0x1f))) == 0)) {
      iVar8 = explist(ls,(expdesc *)local_78);
      if ((local_78._0_4_ & ~VNIL) == VCALL) {
        iVar10 = -1;
        luaK_setreturns(pFVar22,(expdesc *)local_78,-1);
        bVar24 = iVar8 == 1;
        iVar8 = iVar10;
        if ((bVar24 && local_78._0_4_ == VCALL) && (pFVar22->bl->insidetbc == '\0')) {
          pIVar3 = pFVar22->f->code;
          pIVar3[(int)local_70._0_4_] = pIVar3[(int)local_70._0_4_] & 0xffffff80 | 0x45;
        }
      }
      else if (iVar8 == 1) {
        first = luaK_exp2anyreg(pFVar22,(expdesc *)local_78);
        iVar8 = 1;
      }
      else {
        luaK_exp2nextreg(pFVar22,(expdesc *)local_78);
      }
    }
    luaK_ret(pFVar22,first,iVar8);
    if ((ls->t).token != 0x3b) break;
LAB_001148cf:
    luaX_next(ls);
    break;
  case 0x115:
    pFVar22 = ls->fs;
    luaX_next(ls);
    iVar8 = luaK_getlabel(pFVar22);
    list = cond(ls);
    pDVar4 = pFVar22->ls->dyd;
    local_70._0_4_ = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70[9] = 0;
    local_70[8] = pFVar22->nactvar;
    local_70._10_2_ = 1;
    local_78 = (undefined1  [8])pFVar22->bl;
    if (local_78 == (undefined1  [8])0x0) {
      bVar24 = false;
    }
    else {
      bVar24 = *(lu_byte *)((long)&(((LHS_assign *)local_78)->v).u + 3) != '\0';
    }
    local_70[0xb] = bVar24;
    pFVar22->bl = (BlockCnt *)local_78;
    checknext(ls,0x102);
    block(ls);
    iVar9 = luaK_jump(pFVar22);
    luaK_patchlist(pFVar22,iVar9,iVar8);
    check_match(ls,0x105,0x115,iVar10);
    leaveblock(pFVar22);
LAB_001146e9:
    luaK_patchtohere(pFVar22,list);
    break;
  default:
    if (iVar8 == 0x11f) {
      luaX_next(ls);
      pTVar14 = str_checkname(ls);
      checknext(ls,0x11f);
      while ((iVar8 = (ls->t).token, iVar8 == 0x11f || (iVar8 == 0x3b))) {
        statement(ls);
      }
      pFVar22 = ls->fs;
      pDVar4 = ls->dyd;
      iVar9 = pFVar22->firstlabel;
      iVar11 = (pDVar4->label).n;
      if (iVar9 < iVar11) {
        lVar15 = (long)iVar11 - (long)iVar9;
        pLVar19 = (pDVar4->label).arr + iVar9;
        do {
          if (pLVar19->name == pTVar14) goto LAB_001141af;
          pLVar19 = pLVar19 + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      pLVar19 = (Labeldesc *)0x0;
LAB_001141af:
      if (pLVar19 != (Labeldesc *)0x0) {
        statement_cold_1();
LAB_0011490e:
        pcVar21 = "break outside loop";
        goto LAB_00114915;
      }
      iVar9 = luaK_getlabel(pFVar22);
      iVar10 = newlabelentry(ls,&pDVar4->label,pTVar14,iVar10,iVar9);
      if ((0x1ffffff8U >> ((byte)(iVar8 - 0x103U) & 0x1f) & 1) == 0 && iVar8 - 0x103U < 0x1e) {
        (pDVar4->label).arr[iVar10].nactvar = pFVar22->bl->nactvar;
      }
      break;
    }
    if (iVar8 == 0x3b) goto LAB_001148cf;
    goto switchD_00113d78_caseD_103;
  }
LAB_001148d7:
  pFVar22 = ls->fs;
  lVar7 = luaY_nvarstack(pFVar22);
  pFVar22->freereg = lVar7;
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return;
switchD_00113d78_caseD_103:
  pFVar22 = ls->fs;
  suffixedexp(ls,(expdesc *)local_70);
  iVar10 = (ls->t).token;
  if ((iVar10 == 0x3d) || (iVar10 == 0x2c)) {
    local_78 = (undefined1  [8])0x0;
    restassign(ls,(LHS_assign *)local_78,1);
  }
  else {
    if (local_70._0_4_ != VCALL) {
      pcVar21 = "syntax error";
LAB_00114915:
      luaX_syntaxerror(ls,pcVar21);
    }
    *(undefined1 *)((long)pFVar22->f->code + (long)(int)local_70._8_4_ * 4 + 3) = 1;
  }
  goto LAB_001148d7;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls, line);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls, line);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}